

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

int64 __thiscall TTD::EventLog::GetKthEventTimeInLog(EventLog *this,uint32 k)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  int64 iVar3;
  undefined1 local_40 [8];
  Iterator iter;
  uint32 topLevelCount;
  uint32 k_local;
  EventLog *this_local;
  
  iter.m_previousEventMap._0_4_ = 0;
  iter.m_previousEventMap._4_4_ = k;
  TTEventList::GetIteratorAtFirst((Iterator *)local_40,&this->m_eventList);
  while( true ) {
    bVar1 = TTEventList::Iterator::IsValid((Iterator *)local_40);
    if (!bVar1) {
      this_local = (EventLog *)&DAT_ffffffffffffffff;
      return (int64)this_local;
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_40);
    bVar1 = NSLogEvents::IsJsRTActionRootCall(pEVar2);
    if ((bVar1) &&
       (iter.m_previousEventMap._0_4_ = (uint32)iter.m_previousEventMap + 1,
       (uint32)iter.m_previousEventMap == iter.m_previousEventMap._4_4_)) break;
    TTEventList::Iterator::MoveNext((Iterator *)local_40);
  }
  pEVar2 = TTEventList::Iterator::Current((Iterator *)local_40);
  iVar3 = NSLogEvents::GetTimeFromRootCallOrSnapshot(pEVar2);
  return iVar3;
}

Assistant:

int64 EventLog::GetKthEventTimeInLog(uint32 k) const
    {
        uint32 topLevelCount = 0;
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                topLevelCount++;

                if(topLevelCount == k)
                {
                    return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
                }
            }
        }

        return -1;
    }